

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O2

void __thiscall value_matrix4d::test_method(value_matrix4d *this)

{
  undefined1 uVar1;
  size_t sVar2;
  char *local_370;
  char *local_368;
  shared_count local_360;
  Value value;
  Value value1;
  char *local_338;
  char *local_330;
  undefined **local_328;
  ulong local_320;
  shared_count sStack_318;
  char **local_310;
  char *local_308;
  char *local_300;
  char *local_2f8;
  char *local_2f0;
  undefined1 *local_2e8;
  undefined1 *local_2e0;
  char *local_2d8;
  char *local_2d0;
  undefined1 *local_2c8;
  undefined1 *local_2c0;
  char *local_2b8;
  char *local_2b0;
  char *local_2a8;
  char *local_2a0;
  undefined1 *local_298;
  undefined1 *local_290;
  char *local_288;
  char *local_280;
  undefined1 *local_278;
  undefined1 *local_270;
  char *local_268;
  char *local_260;
  undefined1 *local_258;
  undefined1 *local_250;
  char *local_248;
  char *local_240;
  output_test_stream output;
  Matrix4d avector1;
  
  Eigen::DenseBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::setZero
            ((DenseBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)&avector1);
  avector1.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0] =
       0.5;
  avector1.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[1] =
       2.5;
  avector1.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[4] =
       1.5;
  avector1.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[5] =
       3.5;
  dynamicgraph::command::Value::Value(&value1,(Matrix *)&avector1);
  dynamicgraph::command::Value::Value(&value,&value1);
  local_248 = 
  "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/value.cpp"
  ;
  local_240 = "";
  local_258 = &boost::unit_test::basic_cstring<char_const>::null;
  local_250 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_248,0x170);
  uVar1 = dynamicgraph::command::Value::operator==(&value1,&value);
  local_328 = (undefined **)CONCAT71(local_328._1_7_,uVar1);
  local_320 = 0;
  sStack_318.pi_ = (sp_counted_base *)0x0;
  local_370 = "value1 == value";
  local_368 = "";
  _output = &PTR__lazy_ostream_00112c30;
  local_268 = 
  "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/value.cpp"
  ;
  local_260 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_318);
  local_278 = &boost::unit_test::basic_cstring<char_const>::null;
  local_270 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::test_tools::output_test_stream::output_test_stream(&output,&local_278,1);
  dynamicgraph::command::operator<<((ostream *)&output,&value1);
  local_288 = 
  "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/value.cpp"
  ;
  local_280 = "";
  local_298 = &boost::unit_test::basic_cstring<char_const>::null;
  local_290 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_288,0x178);
  local_2a8 = 
  "Type=matrix4d, value=0.5 1.5   0   0\n2.5 3.5   0   0\n  0   0   0   0\n  0   0   0   0";
  sVar2 = boost::unit_test::ut_detail::bcs_char_traits_impl<const_char>::length
                    (
                    "Type=matrix4d, value=0.5 1.5   0   0\n2.5 3.5   0   0\n  0   0   0   0\n  0   0   0   0"
                    );
  local_2a0 = "Type=matrix4d, value=0.5 1.5   0   0\n2.5 3.5   0   0\n  0   0   0   0\n  0   0   0   0"
              + sVar2;
  boost::test_tools::output_test_stream::is_equal(&local_370,&output,&local_2a8,1);
  local_338 = 
  "output.is_equal(\"Type=matrix4d, value=0.5 1.5   0   0\\n\" \"2.5 3.5   0   0\\n  0   0   0   0\\n\" \"  0   0   0   0\")"
  ;
  local_330 = "";
  local_320 = local_320 & 0xffffffffffffff00;
  local_328 = &PTR__lazy_ostream_00112c30;
  sStack_318.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_2b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/value.cpp"
  ;
  local_2b0 = "";
  local_310 = &local_338;
  boost::test_tools::tt_detail::report_assertion(&local_370,&local_328,&local_2b8,0x178,1,0,0);
  boost::detail::shared_count::~shared_count(&local_360);
  boost::test_tools::output_test_stream::~output_test_stream(&output);
  local_2c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2c0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::test_tools::output_test_stream::output_test_stream(&output,&local_2c8,1);
  dynamicgraph::command::operator<<((ostream *)&output,&value);
  local_2d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/value.cpp"
  ;
  local_2d0 = "";
  local_2e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2e0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_2d8,0x181);
  local_2f8 = 
  "Type=matrix4d, value=0.5 1.5   0   0\n2.5 3.5   0   0\n  0   0   0   0\n  0   0   0   0";
  sVar2 = boost::unit_test::ut_detail::bcs_char_traits_impl<const_char>::length
                    (
                    "Type=matrix4d, value=0.5 1.5   0   0\n2.5 3.5   0   0\n  0   0   0   0\n  0   0   0   0"
                    );
  local_2f0 = "Type=matrix4d, value=0.5 1.5   0   0\n2.5 3.5   0   0\n  0   0   0   0\n  0   0   0   0"
              + sVar2;
  boost::test_tools::output_test_stream::is_equal(&local_370,&output,&local_2f8,1);
  local_338 = 
  "output.is_equal(\"Type=matrix4d, value=0.5 1.5   0   0\\n\" \"2.5 3.5   0   0\\n  0   0   0   0\\n\" \"  0   0   0   0\")"
  ;
  local_330 = "";
  local_320 = local_320 & 0xffffffffffffff00;
  local_328 = &PTR__lazy_ostream_00112c30;
  sStack_318.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_308 = 
  "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/value.cpp"
  ;
  local_300 = "";
  local_310 = &local_338;
  boost::test_tools::tt_detail::report_assertion(&local_370,&local_328,&local_308,0x181,1,0,0);
  boost::detail::shared_count::~shared_count(&local_360);
  boost::test_tools::output_test_stream::~output_test_stream(&output);
  dynamicgraph::command::Value::~Value(&value);
  dynamicgraph::command::Value::~Value(&value1);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(value_matrix4d) {
  using dg::command::Value;

  Eigen::Matrix4d avector1;
  avector1.setZero();
  avector1(0, 0) = 0.5;
  avector1(0, 1) = 1.5;
  avector1(1, 0) = 2.5;
  avector1(1, 1) = 3.5;
  Value value1(avector1);
  Value value = value1;

  BOOST_CHECK(value1 == value);

  {
    output_test_stream output;
    output << value1;
    BOOST_CHECK(
        output.is_equal("Type=matrix4d, value=0.5 1.5   0   0\n"
                        "2.5 3.5   0   0\n  0   0   0   0\n"
                        "  0   0   0   0"));
  }

  {
    output_test_stream output;
    output << value;
    BOOST_CHECK(
        output.is_equal("Type=matrix4d, value=0.5 1.5   0   0\n"
                        "2.5 3.5   0   0\n  0   0   0   0\n"
                        "  0   0   0   0"));
  }
}